

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O1

SQObject __thiscall SQCompiler::Expect(SQCompiler *this,SQInteger tok)

{
  SQUnsignedInteger *pSVar1;
  uint uVar2;
  SQDelegable *pSVar3;
  SQObjectType SVar4;
  SQInteger SVar5;
  SQChar *pSVar6;
  SQObjectValue SVar7;
  SQObject SVar8;
  SQObjectPtr ret;
  SQObjectPtr local_30;
  SQObjectPtr local_20;
  
  if ((this->_token != tok) && (tok != 0x102 || this->_token != 0x136)) {
    if (0xff < tok) {
      if (tok - 0x102U < 4) {
        pSVar6 = &DAT_00130c38 + *(int *)(&DAT_00130c38 + (tok - 0x102U) * 4);
      }
      else {
        pSVar6 = SQLexer::Tok2Str(&this->_lex,tok);
      }
      Error(this,"expected \'%s\'",pSVar6);
    }
    Error(this,"expected \'%c\'",tok);
  }
  local_30.super_SQObject._unVal.pTable = (SQTable *)0x0;
  local_30.super_SQObject._type = OT_NULL;
  SVar7.pTable = local_30.super_SQObject._unVal.pTable;
  switch(tok) {
  case 0x102:
    SVar8 = SQFuncState::CreateString(this->_fs,(this->_lex)._svalue,-1);
    SVar7 = SVar8._unVal;
    SVar4 = SVar8._type;
    if ((SVar4 >> 0x1b & 1) != 0) {
      pSVar1 = &((SVar7.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 + 1;
    }
    uVar2 = local_30.super_SQObject._type >> 0x1b;
    local_30.super_SQObject._type = SVar4;
    if ((uVar2 & 1) != 0) {
      pSVar1 = &((local_30.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 - 1;
      if (*pSVar1 == 0) {
        pSVar3 = &(local_30.super_SQObject._unVal.pTable)->super_SQDelegable;
        local_30.super_SQObject._unVal.nInteger = SVar7.nInteger;
        (*(pSVar3->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted[2])();
        SVar7 = local_30.super_SQObject._unVal;
      }
    }
    break;
  case 0x103:
    SVar8 = SQFuncState::CreateString
                      (this->_fs,(this->_lex)._svalue,(this->_lex)._longstr._size - 1);
    SVar7 = SVar8._unVal;
    SVar4 = SVar8._type;
    if ((SVar4 >> 0x1b & 1) != 0) {
      pSVar1 = &((SVar7.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 + 1;
    }
    uVar2 = local_30.super_SQObject._type >> 0x1b;
    local_30.super_SQObject._type = SVar4;
    if ((uVar2 & 1) != 0) {
      pSVar1 = &((local_30.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 - 1;
      if (*pSVar1 == 0) {
        pSVar3 = &(local_30.super_SQObject._unVal.pTable)->super_SQDelegable;
        local_30.super_SQObject._unVal.nInteger = SVar7.nInteger;
        (*(pSVar3->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted[2])();
        SVar7 = local_30.super_SQObject._unVal;
      }
    }
    break;
  case 0x104:
    local_20.super_SQObject._unVal = (SQObjectValue)(this->_lex)._nvalue;
    local_20.super_SQObject._type = OT_INTEGER;
    local_30.super_SQObject._type = OT_INTEGER;
    goto LAB_0010f551;
  case 0x105:
    local_20.super_SQObject._type = OT_FLOAT;
    local_20.super_SQObject._unVal.nInteger._4_4_ = 0;
    local_20.super_SQObject._unVal.fFloat = (this->_lex)._fvalue;
    local_30.super_SQObject._type = OT_FLOAT;
LAB_0010f551:
    local_30.super_SQObject._unVal = local_20.super_SQObject._unVal;
    SQObjectPtr::~SQObjectPtr(&local_20);
    SVar7 = local_30.super_SQObject._unVal;
  }
  local_30.super_SQObject._unVal = SVar7;
  SVar5 = SQLexer::Lex(&this->_lex);
  SVar7 = local_30.super_SQObject._unVal;
  SVar4 = local_30.super_SQObject._type;
  this->_token = SVar5;
  SQObjectPtr::~SQObjectPtr(&local_30);
  SVar8._4_4_ = 0;
  SVar8._type = SVar4;
  SVar8._unVal.pTable = SVar7.pTable;
  return SVar8;
}

Assistant:

SQObject Expect(SQInteger tok)
    {

        if(_token != tok) {
            if(_token == TK_CONSTRUCTOR && tok == TK_IDENTIFIER) {
                //do nothing
            }
            else {
                const SQChar *etypename;
                if(tok > 255) {
                    switch(tok)
                    {
                    case TK_IDENTIFIER:
                        etypename = _SC("IDENTIFIER");
                        break;
                    case TK_STRING_LITERAL:
                        etypename = _SC("STRING_LITERAL");
                        break;
                    case TK_INTEGER:
                        etypename = _SC("INTEGER");
                        break;
                    case TK_FLOAT:
                        etypename = _SC("FLOAT");
                        break;
                    default:
                        etypename = _lex.Tok2Str(tok);
                    }
                    Error(_SC("expected '%s'"), etypename);
                }
                Error(_SC("expected '%c'"), tok);
            }
        }
        SQObjectPtr ret;
        switch(tok)
        {
        case TK_IDENTIFIER:
            ret = _fs->CreateString(_lex._svalue);
            break;
        case TK_STRING_LITERAL:
            ret = _fs->CreateString(_lex._svalue,_lex._longstr.size()-1);
            break;
        case TK_INTEGER:
            ret = SQObjectPtr(_lex._nvalue);
            break;
        case TK_FLOAT:
            ret = SQObjectPtr(_lex._fvalue);
            break;
        }
        Lex();
        return ret;
    }